

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdflib.c
# Opt level: O3

FT_Error bdf_list_ensure_(bdf_list_t_ *list,unsigned_long num_items)

{
  ulong cur_count;
  FT_Error FVar1;
  ulong uVar2;
  char **ppcVar3;
  ulong new_count;
  FT_Error error;
  FT_Error local_1c;
  
  local_1c = 0;
  cur_count = list->size;
  FVar1 = 0;
  if ((cur_count < num_items) && (FVar1 = 0x40, cur_count != 0xfffffff)) {
    uVar2 = (cur_count >> 1) + cur_count + 5;
    new_count = 0xfffffff;
    if (uVar2 < 0xfffffff) {
      new_count = uVar2;
    }
    if (uVar2 < cur_count) {
      new_count = 0xfffffff;
    }
    ppcVar3 = (char **)ft_mem_qrealloc(list->memory,8,cur_count,new_count,list->field,&local_1c);
    list->field = ppcVar3;
    FVar1 = local_1c;
    if (local_1c == 0) {
      list->size = new_count;
      FVar1 = 0;
    }
  }
  return FVar1;
}

Assistant:

static FT_Error
  bdf_list_ensure_( bdf_list_t_*   list,
                    unsigned long  num_items ) /* same as bdf_list_t_.used */
  {
    FT_Error  error = FT_Err_Ok;


    if ( num_items > list->size )
    {
      unsigned long  oldsize = list->size; /* same as bdf_list_t_.size */
      unsigned long  newsize = oldsize + ( oldsize >> 1 ) + 5;
      unsigned long  bigsize = (unsigned long)( FT_INT_MAX / sizeof ( char* ) );
      FT_Memory      memory  = list->memory;


      if ( oldsize == bigsize )
      {
        error = FT_THROW( Out_Of_Memory );
        goto Exit;
      }
      else if ( newsize < oldsize || newsize > bigsize )
        newsize = bigsize;

      if ( FT_QRENEW_ARRAY( list->field, oldsize, newsize ) )
        goto Exit;

      list->size = newsize;
    }

  Exit:
    return error;
  }